

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O1

void __thiscall
rpn::RPNExpression::Push<rpn::StringExpression,char_const(&)[1]>
          (RPNExpression *this,char (*args) [1])

{
  tuple<rpn::IExpression_*,_std::default_delete<rpn::IExpression>_> tVar1;
  size_t sVar2;
  __uniq_ptr_impl<rpn::IExpression,_std::default_delete<rpn::IExpression>_> local_50;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  tVar1.super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
  super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>)
       operator_new(0x28);
  local_48 = &local_38;
  sVar2 = strlen(*args);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,args,args + sVar2);
  *(undefined ***)
   tVar1.super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
   super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl = &PTR__StringExpression_00113ab0;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>
                   .super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 8) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>
                      .super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 0x18);
  if (local_48 == &local_38) {
    *(long *)((long)tVar1.
                    super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>
                    .super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 0x18) =
         local_38;
    *(long *)((long)tVar1.
                    super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>
                    .super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 0x20) =
         lStack_30;
  }
  else {
    *(long **)((long)tVar1.
                     super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>
                     .super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 8) = local_48;
    *(long *)((long)tVar1.
                    super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>
                    .super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 0x18) =
         local_38;
  }
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>
                  .super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 0x10) = local_40;
  local_50._M_t.super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
  super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl =
       (tuple<rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>)
       (tuple<rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>)
       tVar1.super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
       super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>,std::allocator<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>>>
  ::emplace_back<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>>
            ((vector<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>,std::allocator<std::unique_ptr<rpn::IExpression,std::default_delete<rpn::IExpression>>>>
              *)this,(unique_ptr<rpn::IExpression,_std::default_delete<rpn::IExpression>_> *)
                     &local_50);
  if ((_Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>)
      local_50._M_t.
      super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>.
      super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl != (IExpression *)0x0) {
    (**(code **)(*(long *)local_50._M_t.
                          super__Tuple_impl<0UL,_rpn::IExpression_*,_std::default_delete<rpn::IExpression>_>
                          .super__Head_base<0UL,_rpn::IExpression_*,_false>._M_head_impl + 8))();
  }
  return;
}

Assistant:

void Push(ExprArgs&&... args)
    {
        Push(std::make_unique<ExprT>(std::forward<ExprArgs>(args)...));
    }